

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaCompareDecimals(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long rem2;
  unsigned_long rem1;
  unsigned_long lo;
  unsigned_long mi;
  unsigned_long hi;
  int dlen;
  int integy;
  int integx;
  int order;
  xmlSchemaValPtr swp;
  xmlSchemaValPtr y_local;
  xmlSchemaValPtr x_local;
  
  integy = 1;
  if (((*(ushort *)((long)&x->value + 0x1c) & 1) == 0) ||
     ((((x->value).decimal.lo == 0 && ((x->value).decimal.mi == 0)) && ((x->value).decimal.hi == 0))
     )) {
    if (((*(ushort *)((long)&y->value + 0x1c) & 1) != 0) &&
       ((((y->value).decimal.lo != 0 || ((y->value).decimal.mi != 0)) ||
        ((y->value).decimal.hi != 0)))) {
      return 1;
    }
  }
  else {
    if (((*(ushort *)((long)&y->value + 0x1c) & 1) == 0) ||
       ((((y->value).decimal.lo == 0 && ((y->value).decimal.mi == 0)) &&
        ((y->value).decimal.hi == 0)))) {
      return -1;
    }
    integy = -1;
  }
  iVar1 = (uint)(*(ushort *)((long)&x->value + 0x1c) >> 8) -
          (uint)(*(ushort *)((long)&x->value + 0x1c) >> 1 & 0x7f);
  iVar2 = (uint)(*(ushort *)((long)&y->value + 0x1c) >> 8) -
          (uint)(*(ushort *)((long)&y->value + 0x1c) >> 1 & 0x7f);
  if ((iVar1 == 1) && ((x->value).decimal.lo == 0)) {
    if (iVar2 == 1) {
      if ((y->value).decimal.lo == 0) {
        x_local._4_4_ = 0;
      }
      else {
        x_local._4_4_ = -integy;
      }
    }
    else {
      x_local._4_4_ = -integy;
    }
  }
  else if ((iVar2 == 1) && ((y->value).decimal.lo == 0)) {
    if (iVar1 == 1) {
      if ((x->value).decimal.lo == 0) {
        x_local._4_4_ = 0;
      }
      else {
        x_local._4_4_ = integy;
      }
    }
    else {
      x_local._4_4_ = integy;
    }
  }
  else if (iVar2 < iVar1) {
    x_local._4_4_ = integy;
  }
  else if (iVar1 < iVar2) {
    x_local._4_4_ = -integy;
  }
  else {
    hi._0_4_ = (uint)(*(ushort *)((long)&x->value + 0x1c) >> 8) -
               (uint)(*(ushort *)((long)&y->value + 0x1c) >> 8);
    if ((int)hi < 0) {
      mi = (y->value).decimal.hi;
      lo = (y->value).decimal.mi;
      rem1 = (y->value).decimal.lo;
      hi._0_4_ = -(int)hi;
      integy = -integy;
      _integx = x;
    }
    else {
      mi = (x->value).decimal.hi;
      lo = (x->value).decimal.mi;
      rem1 = (x->value).decimal.lo;
      _integx = y;
    }
    for (; 8 < (int)hi; hi._0_4_ = (int)hi + -8) {
      rem1 = lo;
      lo = mi;
      mi = 0;
    }
    for (; 0 < (int)hi; hi._0_4_ = (int)hi + -1) {
      uVar3 = mi % 10;
      mi = mi / 10;
      uVar4 = lo % 10;
      lo = (lo + uVar3 * 100000000) / 10;
      rem1 = (rem1 + uVar4 * 100000000) / 10;
    }
    if ((_integx->value).decimal.hi < mi) {
      x_local._4_4_ = integy;
    }
    else {
      if (mi == (_integx->value).decimal.hi) {
        if ((_integx->value).decimal.mi < lo) {
          return integy;
        }
        if (lo == (_integx->value).decimal.mi) {
          if ((_integx->value).decimal.lo < rem1) {
            return integy;
          }
          if (rem1 == (_integx->value).decimal.lo) {
            if (*(ushort *)((long)&x->value + 0x1c) >> 8 == *(ushort *)((long)&y->value + 0x1c) >> 8
               ) {
              return 0;
            }
            return integy;
          }
        }
      }
      x_local._4_4_ = -integy;
    }
  }
  return x_local._4_4_;
}

Assistant:

static int
xmlSchemaCompareDecimals(xmlSchemaValPtr x, xmlSchemaValPtr y)
{
    xmlSchemaValPtr swp;
    int order = 1, integx, integy, dlen;
    unsigned long hi, mi, lo;

    /*
     * First test: If x is -ve and not zero
     */
    if ((x->value.decimal.sign) &&
	((x->value.decimal.lo != 0) ||
	 (x->value.decimal.mi != 0) ||
	 (x->value.decimal.hi != 0))) {
	/*
	 * Then if y is -ve and not zero reverse the compare
	 */
	if ((y->value.decimal.sign) &&
	    ((y->value.decimal.lo != 0) ||
	     (y->value.decimal.mi != 0) ||
	     (y->value.decimal.hi != 0)))
	    order = -1;
	/*
	 * Otherwise (y >= 0) we have the answer
	 */
	else
	    return (-1);
    /*
     * If x is not -ve and y is -ve we have the answer
     */
    } else if ((y->value.decimal.sign) &&
	       ((y->value.decimal.lo != 0) ||
		(y->value.decimal.mi != 0) ||
		(y->value.decimal.hi != 0))) {
        return (1);
    }
    /*
     * If it's not simply determined by a difference in sign,
     * then we need to compare the actual values of the two nums.
     * To do this, we start by looking at the integral parts.
     * If the number of integral digits differ, then we have our
     * answer.
     */
    integx = x->value.decimal.total - x->value.decimal.frac;
    integy = y->value.decimal.total - y->value.decimal.frac;
    /*
    * NOTE: We changed the "total" for values like "0.1"
    *   (or "-0.1" or ".1") to be 1, which was 2 previously.
    *   Therefore the special case, when such values are
    *   compared with 0, needs to be handled separately;
    *   otherwise a zero would be recognized incorrectly as
    *   greater than those values. This has the nice side effect
    *   that we gain an overall optimized comparison with zeroes.
    * Note that a "0" has a "total" of 1 already.
    */
    if (integx == 1) {
	if (x->value.decimal.lo == 0) {
	    if (integy != 1)
		return -order;
	    else if (y->value.decimal.lo != 0)
		return -order;
	    else
		return(0);
	}
    }
    if (integy == 1) {
	if (y->value.decimal.lo == 0) {
	    if (integx != 1)
		return order;
	    else if (x->value.decimal.lo != 0)
		return order;
	    else
		return(0);
	}
    }

    if (integx > integy)
	return order;
    else if (integy > integx)
	return -order;

    /*
     * If the number of integral digits is the same for both numbers,
     * then things get a little more complicated.  We need to "normalize"
     * the numbers in order to properly compare them.  To do this, we
     * look at the total length of each number (length => number of
     * significant digits), and divide the "shorter" by 10 (decreasing
     * the length) until they are of equal length.
     */
    dlen = x->value.decimal.total - y->value.decimal.total;
    if (dlen < 0) {	/* y has more digits than x */
	swp = x;
	hi = y->value.decimal.hi;
	mi = y->value.decimal.mi;
	lo = y->value.decimal.lo;
	dlen = -dlen;
	order = -order;
    } else {		/* x has more digits than y */
	swp = y;
	hi = x->value.decimal.hi;
	mi = x->value.decimal.mi;
	lo = x->value.decimal.lo;
    }
    while (dlen > 8) {	/* in effect, right shift by 10**8 */
	lo = mi;
	mi = hi;
	hi = 0;
	dlen -= 8;
    }
    while (dlen > 0) {
	unsigned long rem1, rem2;
	rem1 = (hi % 10) * 100000000L;
	hi = hi / 10;
	rem2 = (mi % 10) * 100000000L;
	mi = (mi + rem1) / 10;
	lo = (lo + rem2) / 10;
	dlen--;
    }
    if (hi > swp->value.decimal.hi) {
	return order;
    } else if (hi == swp->value.decimal.hi) {
	if (mi > swp->value.decimal.mi) {
	    return order;
	} else if (mi == swp->value.decimal.mi) {
	    if (lo > swp->value.decimal.lo) {
		return order;
	    } else if (lo == swp->value.decimal.lo) {
		if (x->value.decimal.total == y->value.decimal.total) {
		    return 0;
		} else {
		    return order;
		}
	    }
	}
    }
    return -order;
}